

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O3

aiString * __thiscall
comparer_context::cmp<aiString>
          (aiString *__return_storage_ptr__,comparer_context *this,string *name)

{
  int iVar1;
  basic_ostream<char,_std::char_traits<char>_> *os;
  stringstream ss;
  aiString e;
  string sStack_5d8;
  stringstream local_5b8 [16];
  ostream local_5a8 [380];
  aiString local_42c;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  local_42c.length = 0;
  local_42c.data[0] = '\0';
  memset(local_42c.data + 1,0x1b,0x3ff);
  read<aiString>(this,__return_storage_ptr__,&local_42c);
  if (__return_storage_ptr__->length == local_42c.length) {
    iVar1 = bcmp(__return_storage_ptr__->data,local_42c.data,(ulong)__return_storage_ptr__->length);
    if (iVar1 == 0) {
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::stringstream::stringstream(local_5b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_5a8,"Expected ",9);
  os = generic_inserter<char,std::char_traits<char>,aiString>
                 (mysprint<char,std::char_traits<char>>,local_5a8,&local_42c);
  std::__ostream_insert<char,std::char_traits<char>>(os,", but actual is ",0x10);
  generic_inserter<char,std::char_traits<char>,aiString>
            (mysprint<char,std::char_traits<char>>,os,__return_storage_ptr__);
  std::__cxx11::stringbuf::str();
  failure(this,&sStack_5d8,name);
}

Assistant:

T cmp(const std::string& name) {
        T a,e;
        read(a,e);

        if(a != e) {
            std::stringstream ss;
            failure((ss<< "Expected " << e << ", but actual is " << a,
                ss.str()),name);
        }
    //  std::cout << name << " " << std::hex << a << std::endl;
        return a;
    }